

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

int Abc_NodeFindMuxVar(DdManager *dd,DdNode *bFunc,int nVars)

{
  int iVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  int local_4c;
  int iVar;
  int nSSQ;
  int nSSD;
  int i;
  int SuppSumMin;
  DdNode *bCof1;
  DdNode *bCof0;
  DdNode *bVar;
  int nVars_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  
  nSSD = 1000000;
  local_4c = -1;
  for (nSSQ = 0; nSSQ < nVars; nSSQ = nSSQ + 1) {
    pDVar3 = dd->vars[nSSQ];
    n = Cudd_Cofactor(dd,bFunc,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(n);
    pDVar3 = Cudd_Cofactor(dd,bFunc,pDVar3);
    Cudd_Ref(pDVar3);
    iVar1 = Cudd_SupportSize(dd,n);
    iVar2 = Cudd_SupportSize(dd,pDVar3);
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,pDVar3);
    if (iVar1 + iVar2 < nSSD) {
      nSSD = iVar1 + iVar2;
      local_4c = nSSQ;
    }
  }
  return local_4c;
}

Assistant:

int Abc_NodeFindMuxVar( DdManager * dd, DdNode * bFunc, int nVars )
{
    DdNode * bVar, * bCof0, * bCof1;
    int SuppSumMin = 1000000;
    int i, nSSD, nSSQ, iVar;

//    printf( "\n\nCofactors:\n\n" );
    iVar = -1;
    for ( i = 0; i < nVars; i++ )
    {
        bVar = dd->vars[i];

        bCof0 = Cudd_Cofactor( dd, bFunc, Cudd_Not(bVar) );  Cudd_Ref( bCof0 );
        bCof1 = Cudd_Cofactor( dd, bFunc,          bVar  );  Cudd_Ref( bCof1 );

//        nodD = Cudd_DagSize(bCof0);
//        nodQ = Cudd_DagSize(bCof1);
//        printf( "+%02d: D=%2d. Q=%2d.  ", i, nodD, nodQ );
//        printf( "S=%2d. D=%2d.  ", nodD + nodQ, abs(nodD-nodQ) );

        nSSD = Cudd_SupportSize( dd, bCof0 );
        nSSQ = Cudd_SupportSize( dd, bCof1 );

//        printf( "SD=%2d. SQ=%2d.  ", nSSD, nSSQ );
//        printf( "S=%2d. D=%2d.  ", nSSD + nSSQ, abs(nSSD - nSSQ) );
//        printf( "Cost=%3d. ", Cost(nodD,nodQ,nSSD,nSSQ) );
//        printf( "\n" );

        Cudd_RecursiveDeref( dd, bCof0 );
        Cudd_RecursiveDeref( dd, bCof1 );

        if ( SuppSumMin > nSSD + nSSQ )
        {
             SuppSumMin = nSSD + nSSQ;
             iVar = i;
        }
    }
    return iVar;
}